

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p521(mbedtls_mpi *N)

{
  undefined1 local_98 [8];
  mbedtls_mpi_uint Mp [10];
  undefined1 local_40 [8];
  mbedtls_mpi M;
  size_t i;
  int ret;
  mbedtls_mpi *N_local;
  
  if (N->n < 9) {
    N_local._4_4_ = 0;
  }
  else {
    local_40._0_4_ = 1;
    M._0_8_ = N->n - 8;
    if (10 < (ulong)M._0_8_) {
      M.s = 10;
      M._4_4_ = 0;
    }
    M.n = (size_t)local_98;
    memcpy(local_98,N->p + 8,M._0_8_ << 3);
    i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_40,9);
    if (i._4_4_ == 0) {
      N->p[8] = N->p[8] & 0x1ff;
      for (M.p = (mbedtls_mpi_uint *)0x9; M.p < (mbedtls_mpi_uint *)N->n;
          M.p = (mbedtls_mpi_uint *)((long)M.p + 1)) {
        N->p[(long)M.p] = 0;
      }
      i._4_4_ = mbedtls_mpi_add_abs(N,N,(mbedtls_mpi *)local_40);
    }
    N_local._4_4_ = i._4_4_;
  }
  return N_local._4_4_;
}

Assistant:

static int ecp_mod_p521( mbedtls_mpi *N )
{
    int ret;
    size_t i;
    mbedtls_mpi M;
    mbedtls_mpi_uint Mp[P521_WIDTH + 1];
    /* Worst case for the size of M is when mbedtls_mpi_uint is 16 bits:
     * we need to hold bits 513 to 1056, which is 34 limbs, that is
     * P521_WIDTH + 1. Otherwise P521_WIDTH is enough. */

    if( N->n < P521_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P521_WIDTH - 1 );
    if( M.n > P521_WIDTH + 1 )
        M.n = P521_WIDTH + 1;
    M.p = Mp;
    memcpy( Mp, N->p + P521_WIDTH - 1, M.n * sizeof( mbedtls_mpi_uint ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, 521 % ( 8 * sizeof( mbedtls_mpi_uint ) ) ) );

    /* N = A0 */
    N->p[P521_WIDTH - 1] &= P521_MASK;
    for( i = P521_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}